

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_global_t * wasm_global_new(wasm_store_t *store,wasm_globaltype_t *type,wasm_val_t *val)

{
  ExternType *pEVar1;
  FILE *__stream;
  wasm_global_t *this;
  TypedValue *tv;
  TypedValue value;
  RefPtr<wabt::interp::Global> local_98;
  Value local_78;
  char local_68 [16];
  TypedValue local_58;
  GlobalType local_40;
  
  if ((store == (wasm_store_t *)0x0) || (type == (wasm_globaltype_t *)0x0)) {
    __assert_fail("store && type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x364,
                  "wasm_global_t *wasm_global_new(wasm_store_t *, const wasm_globaltype_t *, const wasm_val_t *)"
                 );
  }
  ToWabtValue(&local_58,val);
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_((string *)&local_78.v128_,(interp *)&local_58,tv);
  fprintf(__stream,"CAPI: [%s] %s\n","wasm_global_new",local_78.i64_);
  if ((char *)local_78.i64_ != local_68) {
    operator_delete((void *)local_78.i64_);
  }
  this = (wasm_global_t *)operator_new(0x18);
  pEVar1 = (type->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_40.super_ExternType.kind = pEVar1->kind;
  if (local_40.super_ExternType.kind == Global) {
    local_40.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001ea970;
    local_40._12_8_ = *(undefined8 *)&pEVar1->field_0xc;
    local_78.i64_ = local_58.value.i64_;
    local_78._8_8_ = local_58.value._8_8_;
    wabt::interp::Store::
    Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
              (&local_98,&store->I,&store->I,&local_40,&local_78);
    wasm_global_t::wasm_global_t(this,&local_98);
    if (local_98.obj_ != (Global *)0x0) {
      wabt::interp::Store::DeleteRoot(local_98.store_,local_98.root_index_);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::GlobalType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_global_t* wasm_global_new(wasm_store_t* store,
                                   const wasm_globaltype_t* type,
                                   const wasm_val_t* val) {
  assert(store && type);
  TypedValue value = ToWabtValue(*val);
  TRACE("%s", TypedValueToString(value).c_str());
  return new wasm_global_t{
      Global::New(store->I, *type->As<GlobalType>(), value.value)};
}